

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  int local_38;
  bool local_32;
  bool local_31;
  int local_30;
  uint local_2c;
  int i;
  int sum;
  undefined1 auStack_20 [3];
  char str [3];
  _Bool absolute;
  _Bool even;
  int f;
  int d;
  char **argv_local;
  int argc_local;
  
  _Var1 = getn("From (default=0): ",(int *)(str + 1),0);
  if ((_Var1) && (_Var1 = getn("To (default=1): ",(int *)auStack_20,1), _Var1)) {
    if (_auStack_20 < stack0xffffffffffffffe4) {
      printf("`To` must be bigger than `from`!\n");
      argv_local._4_4_ = 1;
    }
    else {
      printf("[E]ven or [a]ny? [E/a]: ");
      fgets((char *)((long)&i + 3),3,_stdin);
      local_31 = true;
      if (i._3_1_ != '\n') {
        iVar2 = toupper((int)i._3_1_);
        local_31 = iVar2 == 0x45;
      }
      sum._3_1_ = local_31;
      printf("Absolute? [y/N]: ");
      fgets((char *)((long)&i + 3),3,_stdin);
      local_32 = true;
      if (i._3_1_ == '\n') {
        iVar2 = toupper(10);
        local_32 = iVar2 == 0x59;
      }
      sum._2_1_ = local_32;
      local_2c = 0;
      for (local_30 = stack0xffffffffffffffe4; local_30 <= _auStack_20; local_30 = local_30 + 1) {
        if (((sum._3_1_ & 1) == 0) || (local_30 % 2 == 0)) {
          if (local_32 == false) {
            local_38 = local_30;
          }
          else {
            local_38 = local_30;
            if (local_30 < 1) {
              local_38 = -local_30;
            }
          }
          local_2c = local_38 + local_2c;
        }
      }
      printf("The sum is %d\n",(ulong)local_2c);
      argv_local._4_4_ = 0;
    }
  }
  else {
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
  int d, f;
  bool even, absolute;

  if (
    !getn("From (default=0): ", &d, 0)
    || !getn("To (default=1): ", &f, 1)
  ) {return 0;}

  if (d > f) {
    printf("`To` must be bigger than `from`!\n");
    return 1;
  }

  char str[3];
  printf("[E]ven or [a]ny? [E/a]: ");
  fgets(str, sizeof str, stdin);
  even = *str == '\n' || toupper(*str) == 'E';

  printf("Absolute? [y/N]: ");
  fgets(str, sizeof str, stdin);
  absolute = *str != '\n' || toupper(*str) == 'Y';

  int sum = 0;

  for (int i = d; i <= f; i++) {
    if (!even || i % 2 == 0) sum += absolute ? abs(i) : i;
  }

  printf("The sum is %d\n", sum);

  return 0;
}